

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

cmSourceFile * __thiscall
cmMakefile::CreateSource
          (cmMakefile *this,string *sourceName,bool generated,cmSourceFileLocationKind kind)

{
  cmSourceFile *pcVar1;
  cmake *this_00;
  cmSourceFileLocation *this_01;
  string *file;
  mapped_type *this_02;
  mapped_type *ppcVar2;
  undefined1 local_80 [8];
  string name;
  string local_58;
  cmSourceFile *local_28;
  cmSourceFile *sf;
  cmSourceFileLocationKind kind_local;
  bool generated_local;
  string *sourceName_local;
  cmMakefile *this_local;
  
  sf._0_4_ = kind;
  sf._7_1_ = generated;
  _kind_local = sourceName;
  sourceName_local = (string *)this;
  pcVar1 = (cmSourceFile *)operator_new(0x130);
  cmSourceFile::cmSourceFile(pcVar1,this,_kind_local,(cmSourceFileLocationKind)sf);
  local_28 = pcVar1;
  if ((sf._7_1_ & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"GENERATED",(allocator<char> *)(name.field_2._M_local_buf + 0xf))
    ;
    cmSourceFile::SetProperty(pcVar1,&local_58,"1");
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)(name.field_2._M_local_buf + 0xf));
  }
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back
            (&this->SourceFiles,&local_28);
  this_00 = GetCMakeInstance(this);
  this_01 = cmSourceFile::GetLocation(local_28);
  file = cmSourceFileLocation::GetName_abi_cxx11_(this_01);
  cmake::StripExtension((string *)local_80,this_00,file);
  this_02 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
            ::operator[](&this->SourceFileSearchIndex,(string *)local_80);
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back(this_02,&local_28);
  pcVar1 = local_28;
  if ((cmSourceFileLocationKind)sf == Known) {
    ppcVar2 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
              ::operator[](&this->KnownFileSearchIndex,_kind_local);
    *ppcVar2 = pcVar1;
  }
  pcVar1 = local_28;
  std::__cxx11::string::~string((string *)local_80);
  return pcVar1;
}

Assistant:

cmSourceFile* cmMakefile::CreateSource(const std::string& sourceName,
                                       bool generated,
                                       cmSourceFileLocationKind kind)
{
  cmSourceFile* sf = new cmSourceFile(this, sourceName, kind);
  if (generated) {
    sf->SetProperty("GENERATED", "1");
  }
  this->SourceFiles.push_back(sf);

  auto name =
    this->GetCMakeInstance()->StripExtension(sf->GetLocation().GetName());
#if defined(_WIN32) || defined(__APPLE__)
  name = cmSystemTools::LowerCase(name);
#endif
  this->SourceFileSearchIndex[name].push_back(sf);
  // for "Known" paths add direct lookup (used for faster lookup in GetSource)
  if (kind == cmSourceFileLocationKind::Known) {
    this->KnownFileSearchIndex[sourceName] = sf;
  }

  return sf;
}